

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location.h
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
yy::operator<<(basic_ostream<char,_std::char_traits<char>_> *ostr,location *loc)

{
  filename_type *pfVar1;
  filename_type *pfVar2;
  size_t __n;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  char *pcVar6;
  char local_1e [3];
  char local_1b;
  char local_1a [2];
  
  iVar3 = (loc->end).column;
  iVar5 = 0;
  if (0 < iVar3) {
    iVar5 = iVar3 + -1;
  }
  operator<<(ostr,&loc->begin);
  pfVar1 = (loc->end).filename;
  if ((pfVar1 == (filename_type *)0x0) ||
     (((pfVar2 = (loc->begin).filename, pfVar2 != (filename_type *)0x0 &&
       (__n = pfVar2->_M_string_length, __n == pfVar1->_M_string_length)) &&
      ((__n == 0 ||
       (iVar3 = bcmp((pfVar2->_M_dataplus)._M_p,(pfVar1->_M_dataplus)._M_p,__n), iVar3 == 0)))))) {
    if ((loc->end).line <= (loc->begin).line) {
      if (iVar5 <= (loc->begin).column) {
        return ostr;
      }
      pcVar6 = local_1a + 1;
      local_1a[1] = 0x2d;
      poVar4 = ostr;
      goto LAB_00107047;
    }
    local_1b = '-';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(ostr,&local_1b,1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(loc->end).line);
    pcVar6 = local_1a;
  }
  else {
    local_1e[0] = '-';
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(ostr,local_1e,1);
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    local_1e[1] = 0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1e + 1,1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(loc->end).line);
    pcVar6 = local_1e + 2;
  }
  *pcVar6 = '.';
LAB_00107047:
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,1);
  std::ostream::operator<<((ostream *)poVar4,iVar5);
  return ostr;
}

Assistant:

std::basic_ostream<YYChar>&
  operator<< (std::basic_ostream<YYChar>& ostr, const location& loc)
  {
    location::counter_type end_col
      = 0 < loc.end.column ? loc.end.column - 1 : 0;
    ostr << loc.begin;
    if (loc.end.filename
        && (!loc.begin.filename
            || *loc.begin.filename != *loc.end.filename))
      ostr << '-' << loc.end.filename << ':' << loc.end.line << '.' << end_col;
    else if (loc.begin.line < loc.end.line)
      ostr << '-' << loc.end.line << '.' << end_col;
    else if (loc.begin.column < end_col)
      ostr << '-' << end_col;
    return ostr;
  }